

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::Shell_GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view in,int flags)

{
  bool bVar1;
  const_iterator end;
  int flags_00;
  string_view in_00;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string ninjaConfigReplace;
  iterator skip;
  iterator cend;
  iterator cit;
  int local_38;
  int needQuotes;
  int windows_backslashes;
  undefined1 auStack_20 [4];
  int flags_local;
  string_view in_local;
  string *out;
  
  in_local._M_len = in._M_len;
  flags_00 = (int)in._M_str;
  _auStack_20 = this;
  in_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_38 = 0;
  in_00._M_str._0_4_ = (int)in._M_str;
  in_00._M_len = in_local._M_len;
  in_00._M_str._4_4_ = 0;
  bVar1 = Shell_ArgumentNeedsQuotes(_auStack_20,in_00,flags_00);
  if (bVar1) {
    if (((undefined1  [16])in & (undefined1  [16])0x80) == (undefined1  [16])0x0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
    }
    else {
      if (((undefined1  [16])in & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\'');
    }
  }
  cend = std::basic_string_view<char,_std::char_traits<char>_>::begin
                   ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  end = std::basic_string_view<char,_std::char_traits<char>_>::end
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  for (; cend != end; cend = cend + 1) {
    if ((((undefined1  [16])in & (undefined1  [16])0x40) != (undefined1  [16])0x0) &&
       (ninjaConfigReplace.field_2._8_8_ = Shell_SkipMakeVariables(cend,end),
       (iterator)ninjaConfigReplace.field_2._8_8_ != cend)) {
      while (cend != (iterator)ninjaConfigReplace.field_2._8_8_) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*cend);
        cend = cend + 1;
      }
      local_38 = 0;
      if (cend == end) break;
    }
    if (((undefined1  [16])in & (undefined1  [16])0x100) == (undefined1  [16])0x0) {
      if (((undefined1  [16])in & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
        if (*cend == '\\') {
          local_38 = local_38 + 1;
        }
        else if (*cend == '\"') {
          while (0 < local_38) {
            local_38 = local_38 + -1;
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
        }
        else {
          local_38 = 0;
        }
      }
    }
    else if ((((*cend == '\\') || (*cend == '\"')) || (*cend == '`')) || (*cend == '$')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    if (*cend == '$') {
      if (((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (((undefined1  [16])in & (undefined1  [16])0x2) == (undefined1  [16])0x0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'$');
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"$\"");
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$$");
      }
    }
    else if (*cend == '#') {
      if ((((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (((undefined1  [16])in & (undefined1  [16])0x8) == (undefined1  [16])0x0)) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'#');
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$#");
      }
    }
    else if (*cend == '%') {
      if ((((undefined1  [16])in & (undefined1  [16])0x2) == (undefined1  [16])0x0) &&
         ((((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0 ||
          ((((undefined1  [16])in & (undefined1  [16])0x10) == (undefined1  [16])0x0 &&
           (((undefined1  [16])in & (undefined1  [16])0x20) == (undefined1  [16])0x0)))))) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'%');
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%%");
      }
    }
    else if (*cend == ';') {
      if (((undefined1  [16])in & (undefined1  [16])0x2) == (undefined1  [16])0x0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\";\"");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*cend);
    }
  }
  if (bVar1) {
    while (0 < local_38) {
      local_38 = local_38 + -1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    if (((undefined1  [16])in & (undefined1  [16])0x80) == (undefined1  [16])0x0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\'');
      if (((undefined1  [16])in & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
      }
    }
  }
  if (((undefined1  [16])in & (undefined1  [16])0x200) != (undefined1  [16])0x0) {
    std::__cxx11::string::string((string *)local_90);
    if (((undefined1  [16])in & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
      std::__cxx11::string::operator+=((string *)local_90,'\\');
    }
    std::__cxx11::string::operator+=((string *)local_90,"$${CONFIGURATION}");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"${CONFIGURATION}",&local_b1);
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,(string *)local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string((string *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Shell_GetArgument(cm::string_view in, int flags)
{
  /* Output will be at least as long as input string.  */
  std::string out;
  out.reserve(in.size());

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell_ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
      out += '\'';
    } else {
      out += '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (cm::string_view::iterator cit = in.begin(), cend = in.end();
       cit != cend; ++cit) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      cm::string_view::iterator skip = Shell_SkipMakeVariables(cit, cend);
      if (skip != cit) {
        /* Copy to the end of the make variable references.  */
        while (cit != skip) {
          out += *cit++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (cit == cend) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*cit == '\\' || *cit == '"' || *cit == '`' || *cit == '$') {
        /* This character needs a backslash to escape it.  */
        out += '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*cit == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*cit == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out += '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out += '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*cit == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out += "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out += "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out += '$';
      }
    } else if (*cit == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out += "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out += '#';
      }
    } else if (*cit == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out += "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out += '%';
      }
    } else if (*cit == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out += "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out += ';';
      }
    } else {
      /* Store this character.  */
      out += *cit;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out += '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out += '\'';
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
    } else {
      out += '"';
    }
  }

  if (flags & Shell_Flag_UnescapeNinjaConfiguration) {
    std::string ninjaConfigReplace;
    if (flags & Shell_Flag_IsUnix) {
      ninjaConfigReplace += '\\';
    }
    ninjaConfigReplace += "$${CONFIGURATION}";
    cmSystemTools::ReplaceString(out, ninjaConfigReplace, "${CONFIGURATION}");
  }

  return out;
}